

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  undefined8 extraout_RAX;
  long lVar5;
  ulong uVar6;
  int iVar7;
  Facet *f;
  pointer f_00;
  double dVar8;
  double dVar9;
  double dVar10;
  Point<double> c;
  Point<double> local_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  string filename;
  vector<double,_std::allocator<double>_> dist;
  string local_2d8;
  STL stl;
  string local_280;
  set<int,_std::less<int>,_std::allocator<int>_> tags;
  string local_230;
  string local_210;
  DistanceTree tree;
  ImportedUgrid ugrid;
  
  launderArguments_abi_cxx11_(&arguments,argc,argv);
  bVar2 = isVersionRequested(&arguments);
  if (!bVar2) {
    getFilename(&filename,&arguments);
    std::__cxx11::string::string((string *)&local_210,(string *)&filename);
    bVar2 = isBigEndian(&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::string((string *)&local_2d8,(string *)&filename);
    Parfait::ImportedUgridFactory::readUgrid(&ugrid,&local_2d8,bVar2);
    std::__cxx11::string::~string((string *)&local_2d8);
    getWallTags(&tags,&ugrid);
    cacheSurface(&stl,&ugrid,&tags);
    Parfait::STL::STL::findDomain((Extent<double> *)&dist,&stl);
    Parfait::DistanceTree::DistanceTree(&tree,(Extent<double> *)&dist);
    tree.super_Octree<Parfait::Facet>.max_depth = 0x1a;
    for (f_00 = stl.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
                _M_impl.super__Vector_impl_data._M_start;
        f_00 != stl.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
                _M_impl.super__Vector_impl_data._M_finish; f_00 = f_00 + 1) {
      Parfait::Octree<Parfait::Facet>::insert(&tree.super_Octree<Parfait::Facet>,f_00);
    }
    Parfait::Octree<Parfait::Facet>::contractExtents(&tree.super_Octree<Parfait::Facet>);
    std::chrono::_V2::system_clock::now();
    uVar6 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)ugrid.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)ugrid.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
    uVar3 = SUB168(auVar1 / ZEXT816(3),0);
    iVar7 = SUB164(auVar1 / ZEXT816(3),0);
    c.pos._M_elems[0] = -1.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&dist,(long)iVar7,(value_type_conflict *)&c,(allocator_type *)&local_358);
    printf("Searching for distance of %d points\n",uVar3 & 0xffffffff);
    uVar3 = uVar3 & 0xffffffff;
    if (iVar7 < 1) {
      uVar3 = uVar6;
    }
    lVar5 = 0x10;
    for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      dVar8 = *(double *)
               ((long)ugrid.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar5 + -0x10);
      dVar10 = *(double *)
                ((long)ugrid.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar5 + -8);
      dVar9 = *(double *)
               ((long)ugrid.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar5);
      local_358.pos._M_elems[1] =
           *(double *)
            ((long)ugrid.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar5 + -8);
      local_358.pos._M_elems[2] =
           *(double *)
            ((long)ugrid.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar5);
      local_358.pos._M_elems[0] = dVar8;
      Parfait::DistanceTree::closestPoint(&c,&tree,&local_358);
      dVar8 = dVar8 - c.pos._M_elems[0];
      dVar10 = dVar10 - c.pos._M_elems[1];
      dVar9 = dVar9 - c.pos._M_elems[2];
      dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = SQRT(dVar9 * dVar9 + dVar8 * dVar8 + dVar10 * dVar10);
      lVar5 = lVar5 + 0x18;
    }
    std::chrono::_V2::system_clock::now();
    poVar4 = std::operator<<((ostream *)&std::cout,"Elapsed time ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::string((string *)&local_230,"distance.txt",(allocator *)&c);
    writeToFile(&local_230,&dist,&ugrid.nodes);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::string((string *)&local_280,"boundary.txt",(allocator *)&local_358);
    determineIfBoundaryNodes((vector<int,_std::allocator<int>_> *)&c,&ugrid);
    writeBoundaryDistances
              (&local_280,
               (vector<double,_std::allocator<double>_> *)
               &dist.super__Vector_base<double,_std::allocator<double>_>,
               (vector<int,_std::allocator<int>_> *)&c);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&c);
    std::__cxx11::string::~string((string *)&local_280);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&dist.super__Vector_base<double,_std::allocator<double>_>);
    Parfait::Octree<Parfait::Facet>::~Octree(&tree.super_Octree<Parfait::Facet>);
    Parfait::STL::STL::~STL(&stl);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&tags._M_t);
    Parfait::ImportedUgrid::~ImportedUgrid(&ugrid);
    std::__cxx11::string::~string((string *)&filename);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&arguments);
    return 0;
  }
  printVersionAndExit();
  std::__cxx11::string::~string((string *)&local_280);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dist.super__Vector_base<double,_std::allocator<double>_>);
  Parfait::Octree<Parfait::Facet>::~Octree(&tree.super_Octree<Parfait::Facet>);
  Parfait::STL::STL::~STL(&stl);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&tags._M_t);
  Parfait::ImportedUgrid::~ImportedUgrid(&ugrid);
  std::__cxx11::string::~string((string *)&filename);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arguments);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char* argv[]) {
    std::vector<std::string> arguments = launderArguments(argc, argv);
    if(isVersionRequested(arguments))
        printVersionAndExit();

    std::string filename = getFilename(arguments);
    bool is_big_endian = isBigEndian(filename);

    auto ugrid = Parfait::ImportedUgridFactory::readUgrid(filename, is_big_endian);
    auto tags = getWallTags(ugrid);


    auto stl = cacheSurface(ugrid, tags);

    Parfait::DistanceTree tree(stl.findDomain());
    tree.setMaxDepth(26);

    for(const auto& f : stl.facets){
        tree.insert(f);
    }
    tree.finalize();

    auto start = std::chrono::system_clock::now();
    int nnodes = ugrid.nodes.size() / 3;
    std::vector<double> dist(nnodes, -1);
    printf("Searching for distance of %d points\n", nnodes);
#pragma omp parallel for schedule(guided)
    for(int n = 0; n < nnodes; n++){
        auto p = &ugrid.nodes[3*n+0];
        Parfait::Point<double> point(p[0], p[1], p[2]);
        auto c = tree.closestPoint(p);
        dist[n] = (point - c).magnitude();
    }
    auto end = std::chrono::system_clock::now();
    std::cout << "Elapsed time " << std::chrono::duration_cast<std::chrono::milliseconds>(end - start).count() << std::endl;

    writeToFile("distance.txt", dist, ugrid.nodes);
    writeBoundaryDistances("boundary.txt", dist, determineIfBoundaryNodes(ugrid));
    //printf("Exporting <%s> as vtu.", filename.c_str());
    //Parfait::VtkUnstructuredWriter writer(filename, ugrid);
    //writer.addNodeData("distance", dist.data(), 1);
    //writer.writeBinary();
}